

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall wasm_functype_t::~wasm_functype_t(wasm_functype_t *this)

{
  ExternType *pEVar1;
  
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_functype_t_001e4be8;
  wasm_valtype_vec_delete(&this->params);
  wasm_valtype_vec_delete(&this->results);
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_externtype_t_001e4c30;
  pEVar1 = (this->super_wasm_externtype_t).I._M_t.
           super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
           .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  if (pEVar1 != (ExternType *)0x0) {
    (*pEVar1->_vptr_ExternType[1])();
  }
  (this->super_wasm_externtype_t).I._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl = (ExternType *)0x0;
  return;
}

Assistant:

~wasm_functype_t() {
    wasm_valtype_vec_delete(&params);
    wasm_valtype_vec_delete(&results);
  }